

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O3

void __thiscall
SimpleLoggerMgr::flushStackTraceBuffer(SimpleLoggerMgr *this,RawStackInfo *stack_info)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  void *__ptr;
  size_t sVar4;
  FILE *__stream;
  long lVar5;
  undefined1 *puVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong __maxlen;
  size_t buffer_len;
  uintptr_t actual_addr;
  string msg_str;
  string _func_name;
  int status;
  char addr_str [256];
  char cmd [1024];
  char file_line [1024];
  char mangled_name [1024];
  void *local_dd8;
  long local_dc8;
  undefined1 *local_dc0;
  long local_db8;
  undefined1 local_db0 [16];
  RawStackInfo *local_da0;
  SimpleLoggerMgr *local_d98;
  ulong local_d90;
  pointer local_d88;
  undefined1 *local_d80;
  long local_d78;
  undefined1 local_d70 [20];
  undefined1 local_d5c [4];
  undefined1 *local_d58 [2];
  undefined1 local_d48 [16];
  char local_d38 [256];
  stringstream local_c38 [16];
  long local_c28 [3];
  uint auStack_c10 [22];
  ios_base local_bb8 [896];
  undefined1 local_838 [1024];
  undefined1 local_438 [1032];
  
  local_d88 = (stack_info->stackPtrs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  uVar10 = (ulong)((long)(stack_info->stackPtrs).super__Vector_base<void_*,_std::allocator<void_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)local_d88) >> 3;
  pcVar2 = this->stackTraceBuffer;
  uVar9 = (uint)uVar10;
  __ptr = (void *)backtrace_symbols(local_d88,uVar10 & 0xffffffff);
  if ((int)uVar9 < 2) {
    free(__ptr);
    return;
  }
  uVar10 = (ulong)(uVar9 & 0x7fffffff);
  uVar11 = 1;
  buffer_len = 0;
  local_dc8 = 0;
  local_da0 = stack_info;
  local_d98 = this;
  local_d90 = uVar10;
  do {
    lVar5 = *(long *)((long)__ptr + uVar11 * 8);
    uVar8 = 0;
    while ((0x28 < (ulong)*(byte *)(lVar5 + uVar8) ||
           ((0x10100000001U >> ((ulong)*(byte *)(lVar5 + uVar8) & 0x3f) & 1) == 0))) {
      uVar8 = uVar8 + 1;
    }
    local_dd8 = (void *)0x0;
    if ((*(char *)(lVar5 + uVar8) == '(') && (*(char *)(lVar5 + 1 + uVar8) == '+')) {
      for (lVar7 = 0;
          (cVar1 = *(char *)(uVar8 + lVar5 + 2 + lVar7), cVar1 != '\0' && (cVar1 != ')'));
          lVar7 = lVar7 + 1) {
      }
      sprintf(local_d38,"%.*s",lVar7,lVar5 + (uVar8 + 2 & 0xffffffff));
      std::__cxx11::stringstream::stringstream(local_c38);
      *(uint *)((long)auStack_c10 + *(long *)(local_c28[0] + -0x18)) =
           *(uint *)((long)auStack_c10 + *(long *)(local_c28[0] + -0x18)) & 0xffffffb5 | 8;
      sVar4 = strlen(local_d38);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_c28,local_d38,sVar4);
      std::istream::_M_extract<unsigned_long>((ulong *)local_c38);
      std::__cxx11::stringstream::~stringstream(local_c38);
      std::ios_base::~ios_base(local_bb8);
    }
    else {
      local_dd8 = local_d88[uVar11];
      sprintf(local_d38,"%lx");
    }
    snprintf((char *)local_c38,0x400,"addr2line -f -e %.*s %s",uVar8 & 0xffffffff,
             *(undefined8 *)((long)__ptr + uVar11 * 8),local_d38);
    __stream = popen((char *)local_c38,"r");
    if (__stream != (FILE *)0x0) {
      __isoc99_fscanf(__stream,"%1023s %1023s",local_438,local_838);
      pclose(__stream);
      uVar10 = 0x10000 - buffer_len;
      if (0x10000 < buffer_len) {
        uVar10 = 0;
      }
      iVar3 = snprintf(pcVar2 + buffer_len,uVar10,"#%-2zu 0x%016lx in ",local_dc8,local_dd8);
      uVar8 = (long)iVar3;
      if (uVar10 < (ulong)(long)iVar3) {
        uVar8 = uVar10;
      }
      uVar8 = uVar8 + buffer_len;
      lVar5 = __cxa_demangle(local_438,0,0,local_d5c);
      if (lVar5 == 0) {
        std::__cxx11::string::string
                  ((string *)&local_dc0,*(char **)((long)__ptr + uVar11 * 8),(allocator *)&local_d80
                  );
        local_d80 = local_d70;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d80,local_dc0,local_dc0 + local_db8);
        lVar5 = std::__cxx11::string::find((char *)&local_dc0,0x10a19f,0);
        lVar7 = std::__cxx11::string::rfind((char *)&local_dc0,0x10a5f5,0xffffffffffffffff);
        if (lVar7 == -1) {
          lVar7 = std::__cxx11::string::rfind((char *)&local_dc0,0x10a64d,0xffffffffffffffff);
        }
        if (lVar7 != -1 && lVar5 != -1) {
          std::__cxx11::string::substr((ulong)local_d58,(ulong)&local_dc0);
          std::__cxx11::string::operator=((string *)&local_d80,(string *)local_d58);
          if (local_d58[0] != local_d48) {
            operator_delete(local_d58[0]);
          }
        }
        __maxlen = 0;
        if (uVar8 <= uVar10) {
          __maxlen = uVar10 - uVar8;
        }
        puVar6 = local_438;
        if (local_d78 != 0) {
          puVar6 = local_d80;
        }
        iVar3 = snprintf(pcVar2 + uVar8,__maxlen,"%s() at ",puVar6);
        uVar10 = (long)iVar3;
        if (__maxlen < (ulong)(long)iVar3) {
          uVar10 = __maxlen;
        }
        if (local_d80 != local_d70) {
          operator_delete(local_d80);
        }
        if (local_dc0 != local_db0) {
          operator_delete(local_dc0);
        }
      }
      else {
        __maxlen = 0;
        if (uVar8 <= uVar10) {
          __maxlen = uVar10 - uVar8;
        }
        iVar3 = snprintf(pcVar2 + uVar8,__maxlen,"%s at ",lVar5);
        uVar10 = (long)iVar3;
        if (__maxlen < (ulong)(long)iVar3) {
          uVar10 = __maxlen;
        }
      }
      local_dc8 = local_dc8 + 1;
      uVar10 = uVar10 + uVar8;
      uVar8 = 0;
      if (uVar10 <= __maxlen) {
        uVar8 = __maxlen - uVar10;
      }
      iVar3 = snprintf(pcVar2 + uVar10,uVar8,"%s\n",local_838);
      if ((ulong)(long)iVar3 <= uVar8) {
        uVar8 = (long)iVar3;
      }
      buffer_len = uVar8 + uVar10;
      uVar10 = local_d90;
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != uVar10);
  free(__ptr);
  if (buffer_len != 0) {
    _flushStackTraceBuffer
              (local_d98,buffer_len,local_da0->tidHash,local_da0->kernelTid,local_da0->crashOrigin);
  }
  return;
}

Assistant:

void SimpleLoggerMgr::flushStackTraceBuffer(RawStackInfo& stack_info) {
#if defined(__linux__) || defined(__APPLE__)
    size_t len = _stack_interpret(&stack_info.stackPtrs[0],
                                  stack_info.stackPtrs.size(),
                                  stackTraceBuffer,
                                  stackTraceBufferSize);
    if (!len) return;

    _flushStackTraceBuffer(len,
                           stack_info.tidHash,
                           stack_info.kernelTid,
                           stack_info.crashOrigin);
#endif
}